

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

bool __thiscall libDAI::Properties::GetAs<bool>(Properties *this,PropertyKey *key)

{
  bool bVar1;
  bad_any_cast *anon_var_0;
  PropertyKey *in_stack_ffffffffffffff88;
  Properties *in_stack_ffffffffffffff90;
  
  Get(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar1 = boost::any_cast<bool>((any *)0xb51c63);
  return bVar1;
}

Assistant:

ValueType GetAs(const PropertyKey &key) const {
                try {
                    return boost::any_cast<ValueType>(Get(key));
                } catch( const boost::bad_any_cast & ) {
                    std::cerr << "Cannot cast property " << key << " to ";
                    std::cerr << typeid(ValueType).name() << std::endl;
                    return boost::any_cast<ValueType>(Get(key));
                }
            }